

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int isViableEndCityTerrain(Generator *g,SurfaceNoise *sn,int blockX,int blockZ)

{
  EndNoise *en;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double (*ncol11) [4];
  double (*ncol10) [4];
  uint z;
  double (*ncol11_00) [4];
  double (*ncol10_00) [4];
  uint z_00;
  uint x;
  uint x_00;
  double dx;
  double dz;
  double ncol [3] [3] [4];
  ulong local_38;
  
  en = &g->en;
  x_00 = blockX >> 3 & 0xfffffffe;
  z = blockZ >> 3 & 0xfffffffe;
  sampleNoiseColumnEnd((double *)ncol,sn,en,x_00,z,0xf,0x12);
  z_00 = blockZ >> 3 | 1;
  sampleNoiseColumnEnd(ncol[0][1],sn,en,x_00,z_00,0xf,0x12);
  x = blockX >> 3 | 1;
  sampleNoiseColumnEnd((double *)(ncol + 1),sn,en,x,z,0xf,0x12);
  sampleNoiseColumnEnd(ncol[1][1],sn,en,x,z_00,0xf,0x12);
  iVar1 = getSurfaceHeight((double *)ncol,ncol[0][1],(double *)(ncol + 1),ncol[1][1],0xf,0x12,4,
                           0.875,0.875);
  if ((g->en).mc < 0x17) {
    local_38 = (long)(blockZ >> 4) * 0x9e7f71 + (long)(blockX >> 4) & 0xffffffffffffU ^ 0x5deece66d;
  }
  else {
    local_38 = chunkGenerateRnd(g->seed,blockX >> 4,blockZ >> 4);
  }
  iVar2 = nextInt(&local_38,4);
  switch(iVar2) {
  case 0:
    iVar3 = z + 2;
    sampleNoiseColumnEnd(ncol[0][2],sn,en,x_00,iVar3,0xf,0x12);
    sampleNoiseColumnEnd(ncol[1][2],sn,en,x,iVar3,0xf,0x12);
    iVar2 = x_00 + 2;
    sampleNoiseColumnEnd((double *)(ncol + 2),sn,en,iVar2,z,0xf,0x12);
    sampleNoiseColumnEnd(ncol[2][1],sn,en,iVar2,z_00,0xf,0x12);
    sampleNoiseColumnEnd(ncol[2][2],sn,en,iVar2,iVar3,0xf,0x12);
    ncol10_00 = ncol[1] + 1;
    ncol11_00 = ncol[1] + 2;
    iVar2 = getSurfaceHeight(ncol[0][1],ncol[0][2],*ncol10_00,*ncol11_00,0xf,0x12,4,0.875,0.5);
    ncol10 = ncol[2] + 1;
    iVar3 = getSurfaceHeight((double *)(ncol + 1),*ncol10_00,(double *)(ncol + 2),*ncol10,0xf,0x12,4
                             ,0.5,0.875);
    ncol11 = ncol[2] + 2;
    dx = 0.5;
    dz = dx;
    break;
  case 1:
    sampleNoiseColumnEnd(ncol[0][2],sn,en,x_00,z + 2,0xf,0x12);
    sampleNoiseColumnEnd(ncol[1][2],sn,en,x,z + 2,0xf,0x12);
    ncol10_00 = ncol[0] + 1;
    ncol10 = ncol[1] + 1;
    iVar2 = getSurfaceHeight(*ncol10_00,ncol[0][2],*ncol10,ncol[1][2],0xf,0x12,4,0.875,0.5);
    iVar3 = getSurfaceHeight((double *)ncol,*ncol10_00,(double *)(ncol + 1),*ncol10,0xf,0x12,4,0.25,
                             0.875);
    ncol11_00 = ncol[0] + 2;
    ncol11 = ncol[1] + 2;
    dx = 0.25;
    dz = 0.5;
    break;
  case 2:
    ncol11_00 = ncol[0] + 1;
    ncol11 = ncol[1] + 1;
    iVar2 = getSurfaceHeight((double *)ncol,*ncol11_00,(double *)(ncol + 1),*ncol11,0xf,0x12,4,0.875
                             ,0.25);
    iVar3 = getSurfaceHeight((double *)ncol,*ncol11_00,(double *)(ncol + 1),*ncol11,0xf,0x12,4,0.25,
                             0.875);
    ncol10_00 = ncol[0];
    ncol10 = ncol[1];
    dx = 0.25;
    dz = dx;
    break;
  case 3:
    sampleNoiseColumnEnd((double *)(ncol + 2),sn,en,x_00 + 2,z,0xf,0x12);
    sampleNoiseColumnEnd(ncol[2][1],sn,en,x_00 + 2,z_00,0xf,0x12);
    ncol10_00 = ncol[1];
    ncol11_00 = ncol[1] + 1;
    iVar2 = getSurfaceHeight((double *)ncol,ncol[0][1],*ncol10_00,*ncol11_00,0xf,0x12,4,0.875,0.25);
    ncol10 = ncol[2];
    ncol11 = ncol[2] + 1;
    iVar3 = getSurfaceHeight(*ncol10_00,*ncol11_00,*ncol10,*ncol11,0xf,0x12,4,0.5,0.875);
    dx = 0.5;
    dz = 0.25;
    break;
  default:
    return 0;
  }
  iVar4 = getSurfaceHeight(*ncol10_00,*ncol11_00,*ncol10,*ncol11,0xf,0x12,4,dx,dz);
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  if (iVar3 < iVar1) {
    iVar1 = iVar3;
  }
  if (iVar4 < iVar1) {
    iVar1 = iVar4;
  }
  iVar2 = 0;
  if (0x3b < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int isViableEndCityTerrain(const Generator *g, const SurfaceNoise *sn,
        int blockX, int blockZ)
{
    const EndNoise *en = &g->en;
    int chunkX = blockX >> 4;
    int chunkZ = blockZ >> 4;
    blockX = chunkX * 16 + 7;
    blockZ = chunkZ * 16 + 7;
    int cellx = (blockX >> 3);
    int cellz = (blockZ >> 3);

    enum { y0 = 15, y1 = 18, yn = y1-y0+1 };
    double ncol[3][3][yn];

    sampleNoiseColumnEnd(ncol[0][0], sn, en, cellx, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol[0][1], sn, en, cellx, cellz+1, y0, y1);
    sampleNoiseColumnEnd(ncol[1][0], sn, en, cellx+1, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol[1][1], sn, en, cellx+1, cellz+1, y0, y1);

    int h00, h01, h10, h11;
    h00 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
            y0, y1, 4, (blockX & 7) / 8.0, (blockZ & 7) / 8.0);

    uint64_t cs;
    if (en->mc <= MC_1_18)
        setSeed(&cs, chunkX + chunkZ * 10387313ULL);
    else
        cs = chunkGenerateRnd(g->seed, chunkX, chunkZ);

    switch (nextInt(&cs, 4))
    {
    case 0: // (++) 0
        sampleNoiseColumnEnd(ncol[0][2], sn, en, cellx+0, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[1][2], sn, en, cellx+1, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[2][0], sn, en, cellx+2, cellz+0, y0, y1);
        sampleNoiseColumnEnd(ncol[2][1], sn, en, cellx+2, cellz+1, y0, y1);
        sampleNoiseColumnEnd(ncol[2][2], sn, en, cellx+2, cellz+2, y0, y1);
        h01 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[1][1], ncol[1][2], ncol[2][1], ncol[2][2],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        break;

    case 1: // (-+) 90
        sampleNoiseColumnEnd(ncol[0][2], sn, en, cellx+0, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[1][2], sn, en, cellx+1, cellz+2, y0, y1);
        h01 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        break;

    case 2: // (--) 180
        h01 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        break;

    case 3: // (+-) 270
        sampleNoiseColumnEnd(ncol[2][0], sn, en, cellx+2, cellz+0, y0, y1);
        sampleNoiseColumnEnd(ncol[2][1], sn, en, cellx+2, cellz+1, y0, y1);
        h01 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        break;

    default:
        return 0; // error
    }
    //printf("%d %d %d %d\n", h00, h01, h10, h11);
    if (h01 < h00) h00 = h01;
    if (h10 < h00) h00 = h10;
    if (h11 < h00) h00 = h11;
    return h00 >= 60 ? h00 : 0;
}